

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O0

_Bool math_min(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  double dVar2;
  gravity_value_t value_00;
  gravity_value_t value_01;
  bool bVar3;
  gravity_value_t value;
  uint16_t i;
  _Bool found;
  double dStack_40;
  uint16_t minindex;
  gravity_float_t n;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  if (nargs == 1) {
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,rindex);
  }
  else {
    dStack_40 = 1.79769313486232e+308;
    value.field_1.n._6_2_ = 1;
    bVar3 = false;
    for (value.field_1.n._2_2_ = 1; (ushort)value.field_1.n._2_2_ < nargs;
        value.field_1.n._2_2_ = value.field_1.n._2_2_ + 1) {
      pgVar1 = args[(ushort)value.field_1.n._2_2_].isa;
      dVar2 = args[(ushort)value.field_1.n._2_2_].field_1.f;
      if (pgVar1 == gravity_class_int) {
        if ((double)(long)dVar2 < dStack_40) {
          dStack_40 = (double)(long)dVar2;
          value.field_1.n._6_2_ = value.field_1.n._2_2_;
        }
LAB_00171c79:
        bVar3 = true;
      }
      else if (pgVar1 == gravity_class_float) {
        if (dVar2 < dStack_40) {
          value.field_1.n._6_2_ = value.field_1.n._2_2_;
          dStack_40 = dVar2;
        }
        goto LAB_00171c79;
      }
    }
    if (bVar3) {
      gravity_vm_setslot(vm,args[(ushort)value.field_1.n._6_2_],rindex);
    }
    else {
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_00,rindex);
    }
  }
  return true;
}

Assistant:

static bool math_min (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs == 1) RETURN_VALUE(VALUE_FROM_NULL, rindex);

    gravity_float_t n = GRAVITY_FLOAT_MAX;
    uint16_t minindex = 1;
    bool found = false;

    for (uint16_t i = 1; i<nargs; ++i) {
        gravity_value_t value = GET_VALUE(i);
        if (VALUE_ISA_INT(value)) {
            found = true;
            if ((gravity_float_t)value.n < n) {
                n = (gravity_float_t)value.n;
                minindex = i;
            }
        } else if (VALUE_ISA_FLOAT(value)) {
            found = true;
            if (value.f < n) {
                n = value.f;
                minindex = i;
            }
        } else continue;
    }

    if (!found) {
        RETURN_VALUE(VALUE_FROM_NULL, rindex);
    }

    RETURN_VALUE(GET_VALUE(minindex), rindex);
}